

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::ProtoWriter::WriteTag(ProtoWriter *this,Field *field)

{
  io::CodedOutputStream::WriteVarint32
            ((this->stream_)._M_t.
             super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
             .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl,
             field->number_ << 3 |
             *(uint *)(protobuf::internal::WireFormatLite::kWireTypeForFieldType +
                      (ulong)(uint)field->kind_ * 4));
  return;
}

Assistant:

void ProtoWriter::WriteTag(const google::protobuf::Field& field) {
  WireFormatLite::WireType wire_type = WireFormatLite::WireTypeForFieldType(
      static_cast<WireFormatLite::FieldType>(field.kind()));
  stream_->WriteTag(WireFormatLite::MakeTag(field.number(), wire_type));
}